

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp3.c
# Opt level: O0

int dooptions(Global *global,fppTag *tags)

{
  int iVar1;
  char **ppcVar2;
  byte bVar3;
  char *pcVar4;
  ushort **ppuVar5;
  DEFBUF *pDVar6;
  uint *in_RSI;
  Global *in_RDI;
  bool bVar7;
  char *text_1;
  int endtest;
  int isdatum;
  int size;
  SIZES *sizp;
  char *text;
  char *symbol;
  char end;
  DEFBUF *dp;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar8;
  char *local_58;
  int in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  SIZES *in_stack_ffffffffffffffc0;
  char *local_38;
  uint *local_18;
  
  bVar3 = 0;
  local_18 = in_RSI;
  do {
    bVar8 = 0;
    if (local_18 != (uint *)0x0) {
      bVar8 = bVar3 ^ 0xff;
    }
    if ((bVar8 & 1) == 0) {
      return 0;
    }
    pcVar4 = (char *)(ulong)*local_18;
    switch(pcVar4) {
    case (char *)0x0:
      bVar3 = 1;
      break;
    case (char *)0x1:
      if (*(long *)(local_18 + 2) != 0) {
        in_RDI->cflag = '\x01';
        in_RDI->keepcomments = '\x01';
      }
      break;
    case (char *)0x2:
      local_38 = *(char **)(local_18 + 2);
      while( true ) {
        bVar7 = false;
        if (*local_38 != '\0') {
          bVar7 = *local_38 != '=';
        }
        if (!bVar7) break;
        local_38 = local_38 + 1;
      }
      if (*local_38 != '\0') {
        *local_38 = '\0';
      }
      pDVar6 = defendel((Global *)in_stack_ffffffffffffffc0,
                        (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb4);
      if (pDVar6 == (DEFBUF *)0x0) {
        return 1;
      }
      pcVar4 = savestring((Global *)CONCAT17(bVar8,in_stack_ffffffffffffffa0),pcVar4);
      pDVar6->repl = pcVar4;
      pDVar6->nargs = -1;
      break;
    case (char *)0x3:
      in_RDI->eflag = '\x01';
      break;
    case (char *)0x4:
      if (&in_RDI->incend <= in_RDI->incend) {
        cerror(in_RDI,FATAL_TOO_MANY_INCLUDE_DIRS);
        return 0x11;
      }
      pcVar4 = *(char **)(local_18 + 2);
      ppcVar2 = in_RDI->incend;
      in_RDI->incend = ppcVar2 + 1;
      *ppcVar2 = pcVar4;
      break;
    case (char *)0x5:
      in_RDI->nflag = in_RDI->nflag | *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x6:
      bVar8 = 0;
      if (*(long *)(local_18 + 2) != 0) {
        bVar8 = 2;
      }
      in_RDI->nflag = in_RDI->nflag | bVar8;
      break;
    case (char *)0x7:
      in_RDI->cplusplus = (*(long *)(local_18 + 2) != 0 ^ 0xffU) & 1;
      break;
    case (char *)0x8:
      local_58 = *(char **)(local_18 + 2);
      in_stack_ffffffffffffffc0 = size_table;
      in_stack_ffffffffffffffb8 = (uint)(*local_58 != '*');
      if (*local_58 != '*') {
        in_stack_ffffffffffffffb4 = 0x200;
      }
      else {
        local_58 = local_58 + 1;
        in_stack_ffffffffffffffb4 = 0;
      }
      while( true ) {
        bVar7 = false;
        if ((short)((Global *)in_stack_ffffffffffffffc0)->line != in_stack_ffffffffffffffb4) {
          bVar7 = *local_58 != '\0';
        }
        if (!bVar7) break;
        ppuVar5 = __ctype_b_loc();
        if (((*ppuVar5)[(int)*local_58] & 0x800) == 0) {
          local_58 = local_58 + 1;
        }
        else {
          in_stack_ffffffffffffffbc = 0;
          while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_58] & 0x800) != 0) {
            in_stack_ffffffffffffffbc = *local_58 + -0x30 + in_stack_ffffffffffffffbc * 10;
            local_58 = local_58 + 1;
          }
          if (in_stack_ffffffffffffffb8 == 0) {
            *(short *)&((Global *)in_stack_ffffffffffffffc0)->wrongline =
                 (short)in_stack_ffffffffffffffbc;
          }
          else {
            *(short *)((long)&((Global *)in_stack_ffffffffffffffc0)->line + 2) =
                 (short)in_stack_ffffffffffffffbc;
          }
          in_stack_ffffffffffffffc0 =
               (SIZES *)((long)&((Global *)in_stack_ffffffffffffffc0)->wrongline + 2);
        }
      }
      if ((short)((Global *)in_stack_ffffffffffffffc0)->line == in_stack_ffffffffffffffb4) {
        if (*local_58 != '\0') {
          cerror(in_RDI,WARN_TOO_MANY_VALUES_TO_SIZEOF,0);
        }
      }
      else {
        cerror(in_RDI,WARN_TOO_FEW_VALUES_TO_SIZEOF,0);
      }
      break;
    case (char *)0x9:
      pDVar6 = defendel((Global *)in_stack_ffffffffffffffc0,
                        (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb4);
      if (pDVar6 == (DEFBUF *)0x0) {
        cerror(in_RDI,WARN_NOT_DEFINED,*(undefined8 *)(local_18 + 2));
      }
      break;
    case (char *)0xa:
      in_RDI->wflag = in_RDI->wflag + '\x01';
      break;
    case (char *)0xb:
      strcpy(in_RDI->work,*(char **)(local_18 + 2));
      in_RDI->first_file = *(char **)(local_18 + 2);
      break;
    case (char *)0xc:
      in_RDI->input = *(_func_char_ptr_char_ptr_int_void_ptr **)(local_18 + 2);
      break;
    case (char *)0xd:
      in_RDI->output = *(_func_void_int_void_ptr **)(local_18 + 2);
      break;
    case (char *)0xe:
      in_RDI->userdata = *(void **)(local_18 + 2);
      break;
    case (char *)0xf:
      in_RDI->linelines = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x10:
      in_RDI->error = *(_func_void_void_ptr_char_ptr___va_list_tag_ptr **)(local_18 + 2);
      break;
    case (char *)0x11:
      in_RDI->warnillegalcpp = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x12:
      in_RDI->outputLINE = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x13:
      in_RDI->showversion = *(long *)(local_18 + 2) == 0;
      break;
    case (char *)0x14:
      in_RDI->showincluded = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x15:
      in_RDI->showbalance = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x16:
      in_RDI->showspace = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x17:
      in_RDI->nestcomments = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x18:
      in_RDI->warnnestcomments = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x19:
      in_RDI->warnnoinclude = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x1a:
      in_RDI->outputfile = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x1b:
    case (char *)0x1c:
      if (0x13 < in_RDI->included) {
        cerror(in_RDI,FATAL_TOO_MANY_INCLUDE_FILES);
        return 0x12;
      }
      in_RDI->include[in_RDI->included] = *(char **)(local_18 + 2);
      in_RDI->includeshow[in_RDI->included] = *local_18 == 0x1b;
      in_RDI->included = in_RDI->included + '\x01';
      break;
    case (char *)0x1d:
      in_RDI->rightconcat = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x1e:
      in_RDI->initialfunc = *(char **)(local_18 + 2);
      break;
    case (char *)0x1f:
      pcVar4 = *(char **)(local_18 + 2);
      iVar1 = in_RDI->excluded;
      in_RDI->excluded = iVar1 + 1;
      in_RDI->excludedinit[iVar1] = pcVar4;
      break;
    case (char *)0x20:
      in_RDI->outputfunctions = *(long *)(local_18 + 2) != 0;
      break;
    case (char *)0x21:
      in_RDI->webmode = *(long *)(local_18 + 2) != 0;
      break;
    default:
      cerror(in_RDI,WARN_INTERNAL_ERROR,0);
    }
    local_18 = local_18 + 4;
  } while( true );
}

Assistant:

int dooptions(struct Global *global, struct fppTag *tags)
{
  /*
   * dooptions is called to process command line arguments (-Detc).
   * It is called only at cpp startup.
   */
  DEFBUF *dp;
  char end=FALSE; /* end of taglist */

  while(tags && !end) {
    switch(tags->tag) {
    case FPPTAG_END:
      end=TRUE;
      break;
    case FPPTAG_INITFUNC:
      global->initialfunc = (char *) tags->data;
      break;
    case FPPTAG_DISPLAYFUNCTIONS:
      global->outputfunctions = tags->data?1:0;
      break;
    case FPPTAG_RIGHTCONCAT:
      global->rightconcat = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTMAIN:
      global->outputfile = tags->data?1:0;
      break;
    case FPPTAG_NESTED_COMMENTS:
      global->nestcomments = tags->data?1:0;
      break;
    case FPPTAG_WARNMISSINCLUDE:
      global->warnnoinclude = tags->data?1:0;
      break;
    case FPPTAG_WARN_NESTED_COMMENTS:
      global->warnnestcomments =  tags->data?1:0;
      break;
    case FPPTAG_OUTPUTSPACE:
      global->showspace = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTBALANCE:
      global->showbalance = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTINCLUDES:
      global->showincluded = tags->data?1:0;
      break;
    case FPPTAG_IGNOREVERSION:
#ifdef GDLPP
      global->showversion = tags->data?0:1;
#else
      global->showversion = tags->data?1:0;
#endif
      break;
    case FPPTAG_WARNILLEGALCPP:
      global->warnillegalcpp = tags->data?1:0;
      break;
    case FPPTAG_OUTPUTLINE:
      global->outputLINE = tags->data?1:0;
      break;
    case FPPTAG_KEEPCOMMENTS:
      if(tags->data) {
	global->cflag = TRUE;
	global->keepcomments = TRUE;
      }
      break;
    case FPPTAG_DEFINE:
      /*
       * If the option is just "-Dfoo", make it -Dfoo=1
       */
      {
	char *symbol=(char *)tags->data;
	char *text=symbol;
	while (*text != EOS && *text != '=')
	  text++;
	if (*text == EOS)
	  text = "1";
	else
	  *text++ = EOS;
	/*
	 * Now, save the word and its definition.
	 */
	dp = defendel(global, symbol, FALSE);
	if(!dp)
	  return(FPP_OUT_OF_MEMORY);
	dp->repl = savestring(global, text);
	dp->nargs = DEF_NOARGS;
      }
      break;
    case FPPTAG_IGNORE_NONFATAL:
      global->eflag = TRUE;
      break;
    case FPPTAG_INCLUDE_DIR:
      if (global->incend >= &global->incdir[NINCLUDE]) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_DIRS);
	  return(FPP_TOO_MANY_INCLUDE_DIRS);
      }
      *global->incend++ = (char *)tags->data;
      break;
    case FPPTAG_INCLUDE_FILE:
    case FPPTAG_INCLUDE_MACRO_FILE:
      if (global->included >= NINCLUDE) {
	  cfatal(global, FATAL_TOO_MANY_INCLUDE_FILES);
	  return(FPP_TOO_MANY_INCLUDE_FILES);
      }
      global->include[global->included] = (char *)tags->data;

      global->includeshow[global->included] =
	  (tags->tag == FPPTAG_INCLUDE_FILE);

      global->included++;
      break;
    case FPPTAG_BUILTINS:
      global->nflag|=(tags->data?NFLAG_BUILTIN:0);
      break;
    case FPPTAG_PREDEFINES:
      global->nflag|=(tags->data?NFLAG_PREDEFINE:0);
      break;
    case FPPTAG_IGNORE_CPLUSPLUS:
      global->cplusplus=!tags->data;
      break;
    case FPPTAG_SIZEOF_TABLE:
      {
	SIZES *sizp;	/* For -S		*/
	int size;	/* For -S		*/
	int isdatum;	/* FALSE for -S*	*/
	int endtest;	/* For -S		*/

	char *text=(char *)tags->data;

	sizp = size_table;
	if ( (isdatum = (*text != '*')) ) /* If it's just -S,     */
	  endtest = T_FPTR;	/* Stop here		*/
	else {			/* But if it's -S*      */
	  text++;		/* Step over '*'        */
	  endtest = 0;		/* Stop at end marker	*/
	}
	while (sizp->bits != endtest && *text != EOS) {
	  if (!isdigit(*text)) {    /* Skip to next digit   */
	    text++;
	    continue;
	  }
	  size = 0;		/* Compile the value	*/
	  while (isdigit(*text)) {
	    size *= 10;
	    size += (*text++ - '0');
	  }
	  if (isdatum)
	    sizp->size = size;	/* Datum size		*/
	  else
	    sizp->psize = size; /* Pointer size 	*/
	  sizp++;
	}
	if (sizp->bits != endtest)
	  cwarn(global, WARN_TOO_FEW_VALUES_TO_SIZEOF, NULL);
	else if (*text != EOS)
	  cwarn(global, WARN_TOO_MANY_VALUES_TO_SIZEOF, NULL);
      }
      break;
    case FPPTAG_UNDEFINE:
      if (defendel(global, (char *)tags->data, TRUE) == NULL)
	cwarn(global, WARN_NOT_DEFINED, tags->data);
      break;
    case FPPTAG_OUTPUT_DEFINES:
      global->wflag++;
      break;
    case FPPTAG_INPUT_NAME:
      strcpy(global->work, tags->data);    /* Remember input filename */
      global->first_file=tags->data;
      break;
    case FPPTAG_INPUT:
      global->input=(char *(*)(char *, int, void *))tags->data;
      break;
    case FPPTAG_OUTPUT:
      global->output=(void (*)(int, void *))tags->data;
      break;      
    case FPPTAG_ERROR:
      global->error=(void (*)(void *, char *, va_list))tags->data;
      break;
    case FPPTAG_USERDATA:
      global->userdata=tags->data;
      break;
    case FPPTAG_LINE:
      global->linelines= tags->data?1:0;
      break;
    case FPPTAG_EXCLFUNC:
      global->excludedinit[ global->excluded++ ] = (char *)tags->data;
      break;
    case FPPTAG_WEBMODE:
      global->webmode=(tags->data?1:0);
      break;
    default:
      cwarn(global, WARN_INTERNAL_ERROR, NULL);
      break;
    }
    tags++;
  }
  return(0);
}